

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exchange_dt.h
# Opt level: O1

void __thiscall GatherBcast::kernel(GatherBcast *this,int param_1,int param_2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  double min_dt;
  double local_38;
  undefined1 local_30 [16];
  double local_20;
  
  local_38 = (this->super_ExchangeDt).dt;
  uVar1 = (this->super_ExchangeDt).x;
  uVar2 = (this->super_ExchangeDt).y;
  auVar3._4_4_ = uVar2;
  auVar3._0_4_ = uVar1;
  auVar3._8_8_ = 0;
  local_30 = vcvtdq2pd_avx(auVar3);
  local_20 = (double)(this->super_ExchangeDt).z;
  if ((this->super_ExchangeDt).rank == 0) {
    lVar5 = (long)(this->super_ExchangeDt).n_processes;
    uVar7 = 0xffffffffffffffff;
    if (-1 < lVar5) {
      uVar7 = lVar5 << 5;
    }
    pdVar4 = (double *)operator_new__(uVar7);
  }
  else {
    pdVar4 = (double *)0x0;
  }
  MPI_Gather(&local_38,4,&ompi_mpi_double,pdVar4,4,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  min_dt = -1.0;
  if ((this->super_ExchangeDt).rank == 0) {
    min_dt = *pdVar4;
    auVar8 = ZEXT864((ulong)min_dt);
    lVar5 = (long)(this->super_ExchangeDt).n_processes;
    if (1 < lVar5) {
      lVar6 = 0x20;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)((long)pdVar4 + lVar6);
        auVar3 = vminsd_avx(auVar9,auVar8._0_16_);
        auVar8 = ZEXT1664(auVar3);
        min_dt = auVar3._0_8_;
        lVar6 = lVar6 + 0x20;
      } while (lVar5 * 0x20 != lVar6);
    }
  }
  MPI_Bcast(&min_dt,1,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  if ((pdVar4 != (double *)0x0) && ((this->super_ExchangeDt).rank == 0)) {
    operator_delete__(pdVar4);
  }
  return;
}

Assistant:

inline void kernel(int, int) override
    {
        double tmp[4];
        tmp[0] = dt;
        tmp[1] = x;
        tmp[2] = y;
        tmp[3] = z;

        double* tmps = nullptr;
        if (rank == 0) tmps = new double[4  * n_processes];

        MPI_Gather(tmp, 4, MPI_DOUBLE, tmps, 4, MPI_DOUBLE, 0, MPI_COMM_WORLD);

        double min_dt = -1;
        if (rank == 0)
        {
            min_dt = tmps[0];
            for (int i = 1; i < n_processes; i++)
                if (tmps[4 * i] < min_dt) min_dt = tmps[4 * i];
        }
        MPI_Bcast(&min_dt, 1, MPI_DOUBLE, 0, MPI_COMM_WORLD);
#ifdef DEBUG_MODE
        std::cout << "rank " << rank << " min dt " << min_dt << "\n";
#endif
        if (rank == 0) delete[] tmps;
    }